

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

size_t __thiscall
kj::_::Delimited<kj::ArrayPtr<kj::ArrayPtr<int>_>_>::size
          (Delimited<kj::ArrayPtr<kj::ArrayPtr<int>_>_> *this)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  long lVar4;
  Delimited<kj::ArrayPtr<int>_> *e;
  Delimited<kj::ArrayPtr<int>_> *this_00;
  long lVar5;
  
  ensureStringifiedInitialized(this);
  sVar2 = (this->stringified).size_;
  if (sVar2 == 0) {
    sVar2 = 0;
  }
  else {
    this_00 = (this->stringified).ptr;
    lVar5 = sVar2 * 0x38;
    bVar3 = true;
    sVar2 = 0;
    do {
      lVar4 = 0;
      if (!bVar3) {
        lVar4 = (this->delimiter).content.size_ - 1;
      }
      sVar1 = Delimited<kj::ArrayPtr<int>_>::size(this_00);
      sVar2 = sVar1 + sVar2 + lVar4;
      this_00 = this_00 + 1;
      bVar3 = false;
      lVar5 = lVar5 + -0x38;
    } while (lVar5 != 0);
  }
  return sVar2;
}

Assistant:

size_t size() {
    ensureStringifiedInitialized();

    size_t result = 0;
    bool first = true;
    for (auto& e: stringified) {
      if (first) {
        first = false;
      } else {
        result += delimiter.size();
      }
      result += e.size();
    }
    return result;
  }